

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O2

void __thiscall Cgmres<Model>::Cgmres(Cgmres<Model> *this)

{
  double *pdVar1;
  
  Gmres::Gmres(&this->super_Gmres,0x96,5,1e-06);
  (this->super_Gmres)._vptr_Gmres = (_func_int **)&PTR_Ax_func_00105d78;
  this->t = 0.0;
  pdVar1 = (double *)operator_new__(0x4b0);
  this->U = pdVar1;
  pdVar1 = (double *)operator_new__(0x4b0);
  this->dUdt = pdVar1;
  pdVar1 = (double *)operator_new__(0x10);
  this->x_dxh = pdVar1;
  pdVar1 = (double *)operator_new__(0);
  this->ptau = pdVar1;
  pdVar1 = (double *)operator_new__(0x4b0);
  this->F_dxh_h = pdVar1;
  return;
}

Assistant:

Cgmres(void) : Gmres(len, Model::k_max, Model::tol) {
    t = 0.0;
    U = new double[dim_u * dv];
    dUdt = new double[dim_u * dv];

    x_dxh = new double[dim_x];
    ptau = new double[dim_p * (dv + 1)];

    F_dxh_h = new double[dim_u * dv];
  }